

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O2

void us_poll_start(us_poll_t *p,us_loop_t *loop,int events)

{
  anon_struct_4_2_c726803f_for_state aVar1;
  epoll_event event;
  
  aVar1 = p->state;
  p->state = (anon_struct_4_2_c726803f_for_state)
             ((uint)aVar1 & 0xfffffff |
             (((uint)aVar1 >> 0x1c & 3) + events * 8 | events & 4U) << 0x1c);
  event.events = events;
  event.data = (epoll_data_t)p;
  epoll_ctl(loop->fd,1,((int)aVar1 << 4) >> 4,(epoll_event *)&event);
  return;
}

Assistant:

void us_poll_start(struct us_poll_t *p, struct us_loop_t *loop, int events) {
    p->state.poll_type = us_internal_poll_type(p) | ((events & LIBUS_SOCKET_READABLE) ? POLL_TYPE_POLLING_IN : 0) | ((events & LIBUS_SOCKET_WRITABLE) ? POLL_TYPE_POLLING_OUT : 0);

#ifdef LIBUS_USE_EPOLL
    struct epoll_event event;
    event.events = events;
    event.data.ptr = p;
    epoll_ctl(loop->fd, EPOLL_CTL_ADD, p->state.fd, &event);
#else
    kqueue_change(loop->fd, p->state.fd, 0, events, p);
#endif
}